

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_bucket.c
# Opt level: O0

int bucket_realloc_pairs(bucket b,size_t new_capacity)

{
  void *pvVar1;
  long in_RSI;
  long in_RDI;
  pair pairs;
  uint local_4;
  
  pvVar1 = realloc(*(void **)(in_RDI + 0x10),in_RSI << 4);
  if (pvVar1 != (void *)0x0) {
    *(void **)(in_RDI + 0x10) = pvVar1;
    *(long *)(in_RDI + 8) = in_RSI;
  }
  else {
    log_write_impl_va("metacall",0xb3,"bucket_realloc_pairs",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_bucket.c"
                      ,LOG_LEVEL_ERROR,"Bad pairs reallocation");
  }
  local_4 = (uint)(pvVar1 == (void *)0x0);
  return local_4;
}

Assistant:

int bucket_realloc_pairs(bucket b, size_t new_capacity)
{
	pair pairs = realloc(b->pairs, sizeof(struct pair_type) * new_capacity);

	if (pairs == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Bad pairs reallocation");
		return 1;
	}

	b->pairs = pairs;
	b->capacity = new_capacity;

	return 0;
}